

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

string * __thiscall
chrono::ChEnumMapper<chrono::ChSystemSMC::ContactForceModel>::GetValueAsString_abi_cxx11_
          (string *__return_storage_ptr__,ChEnumMapper<chrono::ChSystemSMC::ContactForceModel> *this
          )

{
  vector<chrono::ChEnumNamePair<chrono::ChSystemSMC::ContactForceModel>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSystemSMC::ContactForceModel>_>_>
  *this_00;
  uint uVar1;
  reference pvVar2;
  ulong __n;
  allocator local_2b;
  char buffer [10];
  
  __n = 0xffffffffffffffff;
  do {
    this_00 = (this->enummap).
              super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSystemSMC::ContactForceModel>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSystemSMC::ContactForceModel>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    __n = __n + 1;
    if ((ulong)(((long)(this_00->
                       super__Vector_base<chrono::ChEnumNamePair<chrono::ChSystemSMC::ContactForceModel>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSystemSMC::ContactForceModel>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                (long)(this_00->
                      super__Vector_base<chrono::ChEnumNamePair<chrono::ChSystemSMC::ContactForceModel>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSystemSMC::ContactForceModel>_>_>
                      )._M_impl.super__Vector_impl_data._M_start) / 0x28) <= __n) {
      uVar1 = (**(this->super_ChEnumMapperBase)._vptr_ChEnumMapperBase)(this);
      sprintf(buffer,"%d",(ulong)uVar1);
      std::__cxx11::string::string((string *)__return_storage_ptr__,buffer,&local_2b);
      return __return_storage_ptr__;
    }
    pvVar2 = std::
             vector<chrono::ChEnumNamePair<chrono::ChSystemSMC::ContactForceModel>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSystemSMC::ContactForceModel>_>_>
             ::at(this_00,__n);
  } while (pvVar2->enumid != *this->value_ptr);
  pvVar2 = std::
           vector<chrono::ChEnumNamePair<chrono::ChSystemSMC::ContactForceModel>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSystemSMC::ContactForceModel>_>_>
           ::at((this->enummap).
                super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSystemSMC::ContactForceModel>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSystemSMC::ContactForceModel>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr,__n);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar2);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string GetValueAsString() override {
        for (int i = 0; i < enummap->size(); ++i)
        {
            if(enummap->at(i).enumid == *value_ptr)
                return enummap->at(i).name;
        }
        // not found, just string as number:
        char buffer [10];
        sprintf(buffer, "%d", GetValueAsInt());
        return std::string(buffer);
    }